

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_t.cpp
# Opt level: O2

void __thiscall deci::string_t::string_t(string_t *this,string *copy)

{
  (this->super_value_t).hash = 1;
  (this->super_value_t)._vptr_value_t = (_func_int **)&PTR_DoHashing_0010fd58;
  std::__cxx11::string::string((string *)&this->val,(string *)copy);
  return;
}

Assistant:

string_t::string_t(const std::string& copy):value_t(),val(copy) {
      ;
    }